

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZRefPattern.cpp
# Opt level: O3

void __thiscall
TPZRefPattern::CreateMidSideNodes
          (TPZRefPattern *this,TPZGeoEl *gel,int side,TPZVec<long> *newnodeindexes)

{
  TPZAdmChunkVector<TPZGeoNode,_10> *this_00;
  int iVar1;
  TPZGeoNode *pTVar2;
  TPZGeoEl *pTVar3;
  ostream *poVar4;
  int k;
  long lVar5;
  long nelem;
  int k_1;
  long lVar6;
  double dVar7;
  double dVar8;
  TPZGeoElSide neighbour;
  TPZManVector<double,_3> refnodecoord_X;
  TPZManVector<double,_3> newnodecoord_X;
  TPZManVector<double,_3> neighbourcoord_X;
  TPZManVector<double,_3> newnodecoord_xi;
  TPZManVector<int,_10> sideNodes;
  TPZManVector<long,_10> sideindices;
  TPZGeoElSide local_200;
  TPZGeoMesh *local_1e8;
  TPZGeoEl *local_1e0;
  long local_1d8;
  double local_1d0;
  TPZManVector<double,_3> local_1c8;
  TPZManVector<double,_3> local_190;
  TPZManVector<double,_3> local_158;
  TPZManVector<double,_3> local_120;
  TPZManVector<int,_10> local_e8;
  TPZManVector<long,_10> local_a0;
  
  local_1e8 = gel->fMesh;
  TPZManVector<int,_10>::TPZManVector(&local_e8,0);
  TPZVec<int>::operator=
            (&local_e8.super_TPZVec<int>,&(this->fFatherSideInfo).fStore[side].fSideNodes);
  (**(code **)(*(long *)gel + 0x188))(&local_200,gel,side);
  local_1e0 = gel;
  TPZManVector<long,_10>::TPZManVector(&local_a0,0);
  if (local_200.fGeoEl != (TPZGeoEl *)0x0) {
    do {
      if ((local_200.fGeoEl == local_1e0) && (local_200.fSide == side)) break;
      iVar1 = TPZGeoElSide::HasSubElement(&local_200);
      if ((iVar1 != 0) &&
         (iVar1 = (**(code **)(*(long *)local_200.fGeoEl + 0x150))(local_200.fGeoEl,local_200.fSide)
         , 1 < iVar1)) {
        (**(code **)(*(long *)local_200.fGeoEl + 0x120))(local_200.fGeoEl,local_200.fSide,&local_a0)
        ;
        break;
      }
      if (local_200.fGeoEl == (TPZGeoEl *)0x0) {
        local_1c8.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZGeoElSide_018f8760;
        local_1c8.super_TPZVec<double>.fStore = (double *)0x0;
        local_1c8.super_TPZVec<double>.fNElements._0_4_ = -1;
      }
      else {
        (**(code **)(*(long *)local_200.fGeoEl + 0x188))
                  (&local_1c8,local_200.fGeoEl,local_200.fSide);
      }
      local_200.fSide = (int)local_1c8.super_TPZVec<double>.fNElements;
      local_200.fGeoEl = (TPZGeoEl *)local_1c8.super_TPZVec<double>.fStore;
    } while ((TPZGeoEl *)local_1c8.super_TPZVec<double>.fStore != (TPZGeoEl *)0x0);
  }
  if (0 < local_e8.super_TPZVec<int>.fNElements) {
    this_00 = &local_1e8->fNodeVec;
    lVar5 = 0;
    do {
      nelem = (long)local_e8.super_TPZVec<int>.fStore[lVar5];
      local_158.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
      local_1d8 = lVar5;
      TPZManVector<double,_3>::TPZManVector(&local_1c8,3,(double *)&local_158);
      local_120.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
      TPZManVector<double,_3>::TPZManVector(&local_158,3,(double *)&local_120);
      lVar5 = 0;
      do {
        pTVar2 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                           (&(this->fRefPatternMesh).fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>,
                            nelem);
        ((long *)local_1c8.super_TPZVec<double>.fStore)[lVar5] = (long)pTVar2->fCoord[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      pTVar3 = Element(this,0);
      iVar1 = (**(code **)(*(long *)pTVar3 + 0x210))(pTVar3);
      local_190.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
      TPZManVector<double,_3>::TPZManVector(&local_120,(long)iVar1,(double *)&local_190);
      lVar5 = 0;
      while( true ) {
        pTVar3 = Element(this,0);
        iVar1 = (**(code **)(*(long *)pTVar3 + 0x210))(pTVar3);
        if (iVar1 <= lVar5) break;
        local_120.super_TPZVec<double>.fStore[lVar5] =
             (double)((long *)local_1c8.super_TPZVec<double>.fStore)[lVar5];
        lVar5 = lVar5 + 1;
      }
      TPZManVector<double,_3>::TPZManVector(&local_190,3);
      (**(code **)(*(long *)local_1e0 + 0x228))(local_1e0,&local_120,&local_190);
      newnodeindexes->fStore[nelem] = -1;
      if (local_a0.super_TPZVec<long>.fNElements < 1) {
        lVar5 = -1;
        dVar7 = -1.0;
      }
      else {
        iVar1 = -1;
        lVar5 = 0;
        dVar7 = -1.0;
        do {
          lVar6 = 0;
          local_1d0 = dVar7;
          do {
            pTVar2 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                               (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,
                                local_a0.super_TPZVec<long>.fStore[lVar5]);
            local_158.super_TPZVec<double>.fStore[lVar6] = pTVar2->fCoord[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar6 != 3);
          dVar8 = 0.0;
          lVar6 = 0;
          do {
            dVar8 = dVar8 + (local_190.super_TPZVec<double>.fStore[lVar6] -
                            local_158.super_TPZVec<double>.fStore[lVar6]) *
                            (local_190.super_TPZVec<double>.fStore[lVar6] -
                            local_158.super_TPZVec<double>.fStore[lVar6]);
            lVar6 = lVar6 + 1;
          } while (lVar6 != 3);
          dVar7 = dVar8;
          if (local_1d0 <= dVar8 && -1 < iVar1) {
            dVar7 = local_1d0;
          }
          if (local_1d0 > dVar8 || -1 >= iVar1) {
            iVar1 = (int)lVar5;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < local_a0.super_TPZVec<long>.fNElements);
        lVar5 = (long)iVar1;
      }
      if (local_a0.super_TPZVec<long>.fNElements != 0 && dVar7 < 0.01) {
        newnodeindexes->fStore[nelem] = local_a0.super_TPZVec<long>.fStore[lVar5];
      }
      if ((0.01 <= dVar7) && (local_a0.super_TPZVec<long>.fNElements != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Refpattern is trying to create midnode but there is another node which is not in the right position!\n"
                   ,0x65);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Either the refinement patterns are incompatible or there is an issue with the mapping.\n"
                   ,0x57);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"newnodecoord_X(",0xf);
        poVar4 = std::ostream::_M_insert<double>(*local_190.super_TPZVec<double>.fStore);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
        poVar4 = std::ostream::_M_insert<double>(local_190.super_TPZVec<double>.fStore[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
        poVar4 = std::ostream::_M_insert<double>(local_190.super_TPZVec<double>.fStore[2]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"neighbourcoord_X(",0x11);
        poVar4 = std::ostream::_M_insert<double>(*local_158.super_TPZVec<double>.fStore);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
        poVar4 = std::ostream::_M_insert<double>(local_158.super_TPZVec<double>.fStore[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
        poVar4 = std::ostream::_M_insert<double>(local_158.super_TPZVec<double>.fStore[2]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Refine/TPZRefPattern.cpp"
                   ,0x29b);
      }
      if (newnodeindexes->fStore[nelem] == -1) {
        iVar1 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this_00);
        pTVar2 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                           (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar1);
        TPZGeoNode::Initialize(pTVar2,&local_190.super_TPZVec<double>,local_1e8);
        newnodeindexes->fStore[nelem] = (long)iVar1;
      }
      TPZManVector<double,_3>::~TPZManVector(&local_190);
      TPZManVector<double,_3>::~TPZManVector(&local_120);
      TPZManVector<double,_3>::~TPZManVector(&local_158);
      TPZManVector<double,_3>::~TPZManVector(&local_1c8);
      lVar5 = local_1d8 + 1;
    } while (lVar5 < local_e8.super_TPZVec<int>.fNElements);
  }
  TPZManVector<long,_10>::~TPZManVector(&local_a0);
  TPZManVector<int,_10>::~TPZManVector(&local_e8);
  return;
}

Assistant:

void TPZRefPattern::CreateMidSideNodes(TPZGeoEl * gel, int side, TPZVec<int64_t> &newnodeindexes)
{
	TPZGeoMesh *gmesh = gel->Mesh();
	//SideNodes returns a vector with the indexes of the internal nodes of the side side
	TPZManVector<int> sideNodes;
	SideNodes(side,sideNodes);
	TPZGeoElSide gelside(gel,side);
	TPZGeoElSide neighbour(gelside.Neighbour());
	TPZManVector<int64_t> sideindices(0);
	//checks if a neighbour element has created a midsidenode already
	while(neighbour.Element() && neighbour != gelside){
		if(neighbour.HasSubElement() && neighbour.Element()->NSideSubElements(neighbour.Side()) > 1)
		{
			neighbour.Element()->MidSideNodeIndices(neighbour.Side(),sideindices);
			break;
		}
		neighbour = neighbour.Neighbour();
	}
	for (int j=0;j<sideNodes.NElements();j++){
		int index = sideNodes[j];
		//new node coordinates
		TPZManVector<REAL,3> refnodecoord_X(3,0.);
		TPZManVector<REAL,3> neighbourcoord_X(3,0.);

		for (int k=0;k<3;k++){
            double coord = fRefPatternMesh.NodeVec()[index].Coord(k);
            refnodecoord_X[k] = coord;
        }

		TPZManVector<REAL,3> newnodecoord_xi(Element(0)->Dimension(),0.);

		//getting node coordinates in refpattern mesh: just a matter of adjusting dimension
		for(int iX = 0; iX < Element(0)->Dimension(); iX++) newnodecoord_xi[iX] = refnodecoord_X[iX];

        //coordinates of the node to be created (if it hasnt been created yet)
		TPZManVector<REAL,3> newnodecoord_X(3);
		gel->X(newnodecoord_xi,newnodecoord_X);

		newnodeindexes[index] = -1;
		REAL smallestDiff = -1.;
		int smallestDiffIndex = -1;
		//check if the node has already been created using information previsouly obtained from neighbour
		for(int i=0; i< sideindices.NElements(); i++)
		{
			for(int k=0; k<3; k++) neighbourcoord_X[k] = gmesh->NodeVec()[sideindices[i]].Coord(k);
			REAL dif = 0.;
			for (int k=0;k<3;k++)
			{
				dif += (newnodecoord_X[k] - neighbourcoord_X[k]) * (newnodecoord_X[k] - neighbourcoord_X[k]);
			}
			if(smallestDiffIndex < 0. || smallestDiff > dif)
			{
				smallestDiff = dif;
				smallestDiffIndex = i;
			}
		}
		if (smallestDiff < 1e-2 && sideindices.NElements() != 0)
		{
			newnodeindexes[index] = sideindices[smallestDiffIndex];
		}
		if (smallestDiff >= 1.e-2 && sideindices.NElements() != 0)
		{
#ifdef PZ_LOG
			{
				std::stringstream sout;
				sout << "Incompatible refinement patterns detected\n";
				sout << "Closest node at distance " << smallestDiff << std::endl;
				gel->Print(sout);
				LOGPZ_ERROR(logger,sout.str())
			}
#endif
            std::cout << "Refpattern is trying to create midnode but there is another node which is not in the right position!\n";
            std::cout << "Either the refinement patterns are incompatible or there is an issue with the mapping.\n";
            std::cout << "newnodecoord_X(" << newnodecoord_X[0] << "," << newnodecoord_X[1] << "," << newnodecoord_X[2] << ")" << std::endl;
            std::cout << "neighbourcoord_X(" << neighbourcoord_X[0] << "," << neighbourcoord_X[1] << "," << neighbourcoord_X[2] << ")" << std::endl;
			DebugStop();
		}
		if (newnodeindexes[index] == -1)
		{
			//If no one has created the node yet, it should be created
			int64_t newindex = gmesh->NodeVec().AllocateNewElement();
			gmesh->NodeVec()[newindex].Initialize(newnodecoord_X,*gmesh);
			newnodeindexes[index] = newindex;
		}
	}
}